

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderBlitting.cpp
# Opt level: O0

IterateResult __thiscall glcts::GeometryShaderBlitting::iterate(GeometryShaderBlitting *this)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *pTVar6;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  undefined8 in_stack_fffffffffffffb78;
  uint uVar10;
  ulong uVar8;
  undefined4 uVar11;
  undefined8 uVar9;
  undefined4 uVar13;
  undefined8 uVar12;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  uint local_3a0;
  uint local_39c;
  uint local_398;
  uint local_394;
  MessageBuilder local_390;
  uint local_20c;
  byte local_208 [4];
  uint index;
  uchar expected_result_data [64];
  uint local_1c0;
  uint local_1bc;
  uint n_1;
  uint n;
  uchar result_data [64];
  uchar layer_target [64];
  uchar layer_source4 [64];
  uchar layer_source3 [64];
  uchar layer_source2 [64];
  uchar layer_source1 [64];
  Functions *gl;
  GeometryShaderBlitting *this_local;
  long lVar5;
  
  uVar10 = (uint)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
               ,0x4a);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error setting up vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                  ,0x51);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_to_draw);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_to_read);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error generating texture objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                  ,0x57);
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo_draw_id);
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo_read_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error setting up framebuffer objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                  ,0x5d);
  (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to_draw);
  uVar8 = (ulong)uVar10 << 0x20;
  (**(code **)(lVar5 + 0x1320))(0x806f,0,0x8058,4,4,4,uVar8,0x1908,0x1401,0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error setting up texture objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                  ,100);
  (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to_read);
  uVar8 = uVar8 & 0xffffffff00000000;
  uVar13 = 0;
  (**(code **)(lVar5 + 0x1320))(0x806f,0,0x8058,4,4,4,uVar8,0x1908,0x1401,0);
  uVar11 = (undefined4)(uVar8 >> 0x20);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Error setting up texture objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                  ,0x69);
  memset(layer_source2 + 0x38,0,0x40);
  memset(layer_source3 + 0x38,0,0x40);
  memset(layer_source4 + 0x38,0,0x40);
  memset(layer_target + 0x38,0,0x40);
  memset(result_data + 0x38,0,0x40);
  for (local_1bc = 0; local_1bc < 0x10; local_1bc = local_1bc + 1) {
    layer_source2[(ulong)(local_1bc << 2) + 0x38] = 0xff;
    layer_source3[(ulong)(local_1bc * 4 + 1) + 0x38] = 0xff;
    layer_source4[(ulong)(local_1bc * 4 + 2) + 0x38] = 0xff;
    layer_target[(ulong)(local_1bc * 4 + 3) + 0x38] = 0xff;
  }
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)this->m_fbo_draw_id,(ulong)this->m_fbo_read_id,(ulong)this->m_to_draw,
             (ulong)this->m_to_read);
  (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to_read);
  uVar9 = CONCAT44(uVar11,4);
  uVar12 = CONCAT44(uVar13,0x1401);
  (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,0,4,uVar9,1,0x1908,uVar12,layer_source2 + 0x38);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),0x1401);
  (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,1,4,uVar9,1,0x1908,uVar12,layer_source3 + 0x38);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),0x1401);
  (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,2,4,uVar9,1,0x1908,uVar12,layer_source4 + 0x38);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),0x1401);
  (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,3,4,uVar9,1,0x1908,uVar12,layer_target + 0x38);
  uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
  uVar11 = (undefined4)((ulong)uVar9 >> 0x20);
  (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to_draw);
  uVar9 = CONCAT44(uVar11,4);
  uVar12 = CONCAT44(uVar13,0x1401);
  (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,0,4,uVar9,1,0x1908,uVar12,result_data + 0x38);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),0x1401);
  (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,1,4,uVar9,1,0x1908,uVar12,result_data + 0x38);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),0x1401);
  (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,2,4,uVar9,1,0x1908,uVar12,result_data + 0x38);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),0x1401);
  (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,3,4,uVar9,1,0x1908,uVar12,result_data + 0x38);
  uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
  uVar11 = (undefined4)((ulong)uVar9 >> 0x20);
  GVar3 = (**(code **)(lVar5 + 0x170))(0x8ca9);
  this->m_draw_fbo_completeness = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x170))(0x8ca8);
  this->m_read_fbo_completeness = GVar3;
  if (this->m_draw_fbo_completeness == 0x8cd5) {
    if (this->m_read_fbo_completeness != 0x8cd5) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "Read framebuffer is reported as incomplete, though expected it to be complete",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                 ,0xa3);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar5 + 0x140))(0,0,4,4,0,0,CONCAT44(uVar11,4),4,0x4000,CONCAT44(uVar13,0x2600));
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"Error blitting",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                    ,0xaa);
    local_1c0 = 0;
    do {
      if (3 < local_1c0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      memset(local_208,0,0x40);
      if (local_1c0 == 0) {
        memcpy(local_208,layer_source2 + 0x38,0x40);
      }
      (**(code **)(lVar5 + 0x78))(0x8ca8,this->m_fbo_draw_id);
      (**(code **)(lVar5 + 0x6b8))(0x8ca8,0x8ce0,this->m_to_draw,0,local_1c0);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"Error setting up FBOs setUpFramebuffersForReading",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                      ,0xba);
      (**(code **)(lVar5 + 0x1220))(0,0,4,4,0x1908,0x1401,&n_1);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"Failed to read rendered pixel data",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                      ,0xbf);
      for (local_20c = 0; local_20c < 0x40; local_20c = local_20c + 4) {
        if (*(int *)(local_208 + local_20c) != *(int *)((long)&n_1 + (ulong)local_20c)) {
          this_01 = tcu::TestContext::getLog
                              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_390,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_390,(char (*) [16])0x2b1530d);
          local_394 = (uint)*(byte *)((long)&n_1 + (ulong)local_20c);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_394);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
          local_398 = (uint)*(byte *)((long)&n_1 + (ulong)(local_20c + 1));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_398);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
          local_39c = (uint)*(byte *)((long)&n_1 + (ulong)(local_20c + 2));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_39c);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
          local_3a0 = (uint)*(byte *)((long)&n_1 + (ulong)(local_20c + 3));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_3a0);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(char (*) [37])"] is different from reference data [");
          local_3a4 = (uint)local_208[local_20c];
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_3a4);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
          local_3a8 = (uint)local_208[local_20c + 1];
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_3a8);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
          local_3ac = (uint)local_208[local_20c + 2];
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_3ac);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
          local_3b0 = (uint)local_208[local_20c + 3];
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_3b0);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x2afbe51);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_390);
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
          return STOP;
        }
      }
      local_1c0 = local_1c0 + 1;
    } while( true );
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Draw framebuffer is reported as incomplete, though expected it to be complete",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
             ,0x9e);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderBlitting::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Generate and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up vertex array object");

	/* Generate texture objects */
	gl.genTextures(1, &m_to_draw);
	gl.genTextures(1, &m_to_read);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture objects");

	/* Generate framebuffer objects */
	gl.genFramebuffers(1, &m_fbo_draw_id);
	gl.genFramebuffers(1, &m_fbo_read_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up framebuffer objects");

	/* Configure texture storage */
	gl.bindTexture(GL_TEXTURE_3D, m_to_draw);
	gl.texImage3D(GL_TEXTURE_3D, 0 /* level */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH, 0 /* border */,
				  GL_RGBA, GL_UNSIGNED_BYTE, NULL);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up texture objects");

	gl.bindTexture(GL_TEXTURE_3D, m_to_read);
	gl.texImage3D(GL_TEXTURE_3D, 0 /* level */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH, 0 /* border */,
				  GL_RGBA, GL_UNSIGNED_BYTE, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up texture objects");

	unsigned char layer_source1[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char layer_source2[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char layer_source3[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char layer_source4[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char layer_target[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char result_data[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];

	memset(layer_source1, 0, sizeof(layer_source1));
	memset(layer_source2, 0, sizeof(layer_source2));
	memset(layer_source3, 0, sizeof(layer_source3));
	memset(layer_source4, 0, sizeof(layer_source4));
	memset(layer_target, 0, sizeof(layer_target));

	for (unsigned int n = 0; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
	{
		layer_source1[n * TEXTURE_TEXEL_COMPONENTS + 0] = 255;
		layer_source2[n * TEXTURE_TEXEL_COMPONENTS + 1] = 255;
		layer_source3[n * TEXTURE_TEXEL_COMPONENTS + 2] = 255;
		layer_source4[n * TEXTURE_TEXEL_COMPONENTS + 3] = 255;
	} /* for (all pixels) */

	/* Set up draw FBO */
	setUpFramebuffersForRendering(m_fbo_draw_id, m_fbo_read_id, m_to_draw, m_to_read);

	/* Fill texture objects with data */
	gl.bindTexture(GL_TEXTURE_3D, m_to_read);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_source1);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_source2);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_source3);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_source4);

	gl.bindTexture(GL_TEXTURE_3D, m_to_draw);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_target);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_target);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_target);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_target);

	/* Check FB completeness */
	m_draw_fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);
	m_read_fbo_completeness = gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	if (m_draw_fbo_completeness != GL_FRAMEBUFFER_COMPLETE)
	{
		TCU_FAIL("Draw framebuffer is reported as incomplete, though expected it to be complete");
	}

	if (m_read_fbo_completeness != GL_FRAMEBUFFER_COMPLETE)
	{
		TCU_FAIL("Read framebuffer is reported as incomplete, though expected it to be complete");
	}

	/* Blit! */
	gl.blitFramebuffer(0 /* srcX0 */, 0 /* srcY0 */, TEXTURE_WIDTH, TEXTURE_HEIGHT, 0 /* dstX0 */, 0 /* dstY0 */,
					   TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_COLOR_BUFFER_BIT, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error blitting");

	for (unsigned int n = 0; n < TEXTURE_DEPTH /* layers */; ++n)
	{
		unsigned char expected_result_data[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
		memset(expected_result_data, 0, sizeof(expected_result_data));

		if (n == 0)
		{
			memcpy(expected_result_data, layer_source1, sizeof(expected_result_data));
		}

		/* Set up read FBO */
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_draw_id);

		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_draw, 0, n);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up FBOs setUpFramebuffersForReading");

		/* Read the rendered data */
		gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, result_data);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to read rendered pixel data");

		/* Compare the rendered data with reference data */
		for (unsigned int index = 0; index < TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS;
			 index += TEXTURE_TEXEL_COMPONENTS)
		{
			if (memcmp(&expected_result_data[index], &result_data[index], TEXTURE_TEXEL_COMPONENTS) != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << (int)result_data[index + 0] << ", "
								   << (int)result_data[index + 1] << ", " << (int)result_data[index + 2] << ", "
								   << (int)result_data[index + 3] << "] is different from reference data ["
								   << (int)expected_result_data[index + 0] << ", "
								   << (int)expected_result_data[index + 1] << ", "
								   << (int)expected_result_data[index + 2] << ", "
								   << (int)expected_result_data[index + 3] << "] !" << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		} /* for (each index) */
	}	 /* for (all layers) */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}